

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpInputPortDeclSyntax::setChild
          (UdpInputPortDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UdpInputPortDeclSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_UdpPortDeclSyntax).attributes,pSVar1);
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->keyword).info = local_20;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_c9);
      std::operator+(&local_a8,&local_c8,":");
      std::__cxx11::to_string(&local_100,0x3417);
      std::operator+(&local_88,&local_a8,&local_100);
      std::operator+(&local_68,&local_88,": ");
      std::operator+(&local_48,&local_68,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>>
                       (pSVar2);
    SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::operator=(&this->names,pSVar3);
  }
  return;
}

Assistant:

void UdpInputPortDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: names = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}